

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::ReadPixels::exec(ReadPixels *this,Thread *t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  GLenum GVar6;
  code *pcVar7;
  deUint32 err;
  deBool dVar8;
  MessageBuilder *pMVar9;
  reference pvVar10;
  DataBlock *this_00;
  size_type size;
  MessageBuilder local_370;
  MessageBuilder local_1e0;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  EGLThread *thread;
  Thread *t_local;
  ReadPixels *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    __cxa_bad_cast();
  }
  iVar1 = this->m_width;
  iVar2 = this->m_x;
  iVar3 = this->m_y;
  iVar4 = this->m_height;
  std::allocator<unsigned_char>::allocator(&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
             (long)((iVar1 - iVar2) * (iVar4 - iVar3) * 4),&local_39);
  std::allocator<unsigned_char>::~allocator(&local_39);
  tcu::ThreadUtil::Thread::newMessage
            (&local_1e0,
             (Thread *)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1e0,(char (*) [23])"Begin -- glReadPixels(");
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,&this->m_x);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x584b6d);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,&this->m_y);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x584b6d);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,&this->m_width);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x584b6d);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,&this->m_height);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x584b6d);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,&this->m_format);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x584b6d);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,&this->m_type);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(char (*) [10])0x57ee06);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1e0);
  do {
    pcVar7 = *(code **)(*(long *)(data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 0x88) + 0x1220
                       );
    iVar1 = this->m_x;
    iVar2 = this->m_y;
    iVar3 = this->m_width;
    iVar4 = this->m_height;
    GVar5 = this->m_format;
    GVar6 = this->m_type;
    pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    (*pcVar7)(iVar1,iVar2,iVar3,iVar4,GVar5,GVar6,pvVar10);
    err = (**(code **)(*(long *)(data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 0x88) + 0x800))
                    ();
    glu::checkError(err,"readPixels(m_x, m_y, m_width, m_height, m_format, m_type, &(data[0]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x74f);
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  tcu::ThreadUtil::Thread::newMessage
            (&local_370,
             (Thread *)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  pMVar9 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_370,(char (*) [22])"End -- glReadPixels()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar9,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_370);
  this_00 = de::SharedPtr<tcu::ThreadUtil::DataBlock>::operator->(&this->m_data);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  tcu::ThreadUtil::DataBlock::setData(this_00,size,pvVar10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void ReadPixels::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	DE_ASSERT(m_type == GL_UNSIGNED_BYTE);
	DE_ASSERT(m_format == GL_RGBA);

	std::vector<deUint8> data((m_width-m_x)*(m_height-m_y)*4);

	thread.newMessage() << "Begin -- glReadPixels(" << m_x << ", " << m_y << ", " << m_width << ", " << m_height << ", " << m_format << ", " << m_type << ", <data>)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, readPixels(m_x, m_y, m_width, m_height, m_format, m_type, &(data[0])));
	thread.newMessage() << "End -- glReadPixels()" << tcu::ThreadUtil::Message::End;

	m_data->setData(data.size(), &(data[0]));
}